

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O3

optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmWindowsRegistry::ExpandExpression_abi_cxx11_
          (optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmWindowsRegistry *this,string_view expression,View view,
          string_view separator)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  undefined4 in_register_00000084;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_311;
  size_type local_310;
  ulong local_308;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  long *local_2c0 [2];
  long local_2b0 [2];
  size_type local_2a0;
  char *local_298;
  RegularExpression local_290;
  long local_60;
  long lStack_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  ulong local_40;
  char *pcStack_38;
  
  pcVar5 = expression._M_str;
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,pcVar5,pcVar5 + expression._M_len,pcVar5,
             CONCAT44(in_register_00000084,view));
  local_2a0 = 1;
  local_298 = ";";
  local_290.regmust = (char *)0x0;
  local_290.program = (char *)0x0;
  local_290.progsize = 0;
  memset(&local_290,0,0x20a);
  cmsys::RegularExpression::compile
            (&local_290,
             "\\[({.+})?(HKCU|HKEY_CURRENT_USER|HKLM|HKEY_LOCAL_MACHINE|HKCR|HKEY_CLASSES_ROOT|HKCC|HKEY_CURRENT_CONFIG|HKU|HKEY_USERS)[/\\]?([^]]*)\\]"
            );
  local_40 = 0;
  pcStack_38 = (char *)0x0;
  local_50._M_len = 0;
  local_50._M_str = (char *)0x0;
  local_60 = 0;
  lStack_58 = 0;
  bVar1 = cmsys::RegularExpression::find(&local_290,(char *)local_2c0[0],&local_290.regmatch);
  if (bVar1) {
    lVar6 = (long)local_290.regmatch.endp[1] - (long)local_290.regmatch.startp[1];
    pcVar5 = local_298;
    uVar7 = local_2a0;
    if (lVar6 != 0) {
      uVar7 = lVar6 - 1U;
      if (lVar6 - 2U <= lVar6 - 1U) {
        uVar7 = lVar6 - 2U;
      }
      pcVar5 = (char *)((long)local_2c0[0] +
                       (long)(local_290.regmatch.startp[1] +
                             (1 - (long)local_290.regmatch.searchstring)));
    }
    local_60 = (long)local_290.regmatch.endp[2] - (long)local_290.regmatch.startp[2];
    lStack_58 = (long)local_2c0[0] +
                ((long)local_290.regmatch.startp[2] - (long)local_290.regmatch.searchstring);
    local_50._M_len = (long)local_290.regmatch.endp[3] - (long)local_290.regmatch.startp[3];
    local_50._M_str =
         (char *)((long)local_2c0[0] +
                 ((long)local_290.regmatch.startp[3] - (long)local_290.regmatch.searchstring));
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_50,pcVar5,0,uVar7);
    if (sVar3 == 0xffffffffffffffff) {
      local_40 = 0;
      pcStack_38 = "";
    }
    else {
      uVar7 = uVar7 + sVar3;
      if (local_50._M_len < uVar7) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar7);
      }
      pcVar5 = local_50._M_str + uVar7;
      local_40 = local_50._M_len - uVar7;
      iVar8 = (int)local_40;
      pcStack_38 = pcVar5;
      if (local_40 == 0) {
        iVar9 = iVar8 + -9;
        uVar4 = local_50._M_len;
      }
      else {
        local_308 = local_50._M_len;
        uVar7 = 9;
        if (local_40 < 9) {
          uVar7 = local_40;
        }
        lVar6 = 0;
        local_310 = sVar3;
        local_300 = __return_storage_ptr__;
        do {
          iVar9 = tolower((int)pcVar5[lVar6]);
          iVar2 = tolower((int)"(default)"[lVar6]);
          iVar9 = iVar9 - iVar2;
          sVar3 = local_310;
          uVar4 = local_308;
          __return_storage_ptr__ = local_300;
          if (iVar9 != 0) goto LAB_00530dcb;
          lVar6 = lVar6 + 1;
        } while (uVar7 + (uVar7 == 0) != lVar6);
        iVar9 = iVar8 + -9;
      }
LAB_00530dcb:
      if (iVar9 == 0) {
        local_40 = 0;
        pcStack_38 = "";
      }
      local_50._M_len = sVar3;
      if (uVar4 < sVar3) {
        local_50._M_len = uVar4;
      }
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = false;
  }
  else {
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f8,pcVar5,pcVar5 + expression._M_len);
    __l._M_len = 1;
    __l._M_array = &local_2f8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2d8,__l,&local_311);
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl = local_2d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 8) =
         local_2d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 0x10) =
         local_2d8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_290.program != (char *)0x0) {
    operator_delete__(local_290.program);
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::vector<std::string>> cmWindowsRegistry::ExpandExpression(
  cm::string_view expression, View view, cm::string_view separator)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  static std::string NOTFOUND{ "/REGISTRY-NOTFOUND" };

  this->LastError.clear();

  // compute list of registry views
  auto views = this->ComputeViews(view);
  std::vector<std::string> result;

  for (auto v : views) {
    ExpressionParser parser(expression);

    while (parser.Find()) {
      try {
        auto handler =
          KeyHandler::OpenKey(parser.GetRootKey(), parser.GetSubKey(), v);
        auto data = handler.ReadValue(parser.GetValueName(),
                                      this->SupportedTypes, separator);
        parser.Replace(data);
      } catch (const registry_error& e) {
        this->LastError = e.what();
        parser.Replace(NOTFOUND);
        continue;
      }
    }
    result.emplace_back(parser.GetExpression());
    if (expression == parser.GetExpression()) {
      // there no substitutions, so can ignore other views
      break;
    }
  }

  return result;
#else
  (void)view;
  (void)separator;

  ExpressionParser parser(expression);
  if (parser.Find()) {
    // expression holds unsupported registry access
    // so the expression cannot be used on this platform
    return cm::nullopt;
  }
  return std::vector<std::string>{ std::string{ expression } };
#endif
}